

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::read_tags
          (basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,error_code *ec)

{
  byte *pbVar1;
  bool bVar2;
  ushort uVar3;
  uint64_t uVar4;
  byte bVar5;
  uint uVar6;
  
  pbVar1 = (this->source_).current_;
  uVar6 = 0x100;
  if (pbVar1 < (this->source_).end_) {
    uVar6 = (uint)*pbVar1;
  }
  if (uVar6 < 0x100) {
    bVar5 = (byte)uVar6 >> 5;
    do {
      if (bVar5 != 6) {
        return;
      }
      uVar4 = get_uint64_value(this,ec);
      bVar5 = 6;
      if (ec->_M_value == 0) {
        if (uVar4 == 0x100) {
          *(byte *)&(this->other_tags_).super__Base_bitset<1UL>._M_w =
               (byte)(this->other_tags_).super__Base_bitset<1UL>._M_w | 2;
        }
        else if (uVar4 == 0x19) {
          *(byte *)&(this->other_tags_).super__Base_bitset<1UL>._M_w =
               (byte)(this->other_tags_).super__Base_bitset<1UL>._M_w | 1;
        }
        else {
          *(byte *)&(this->other_tags_).super__Base_bitset<1UL>._M_w =
               (byte)(this->other_tags_).super__Base_bitset<1UL>._M_w | 4;
          this->raw_tag_ = uVar4;
        }
        pbVar1 = (this->source_).current_;
        uVar3 = 0x100;
        if (pbVar1 < (this->source_).end_) {
          uVar3 = (ushort)*pbVar1;
        }
        if (0xff < uVar3) {
          std::error_code::operator=(ec,unexpected_eof);
          this->more_ = false;
          goto LAB_0025c3af;
        }
        bVar5 = (byte)uVar3 >> 5;
        bVar2 = true;
      }
      else {
LAB_0025c3af:
        bVar2 = false;
      }
    } while (bVar2);
  }
  else {
    std::error_code::operator=(ec,unexpected_eof);
    this->more_ = false;
  }
  return;
}

Assistant:

void read_tags(std::error_code& ec)
    {
        auto c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        jsoncons::cbor::detail::cbor_major_type major_type = get_major_type(c.value);

        while (major_type == jsoncons::cbor::detail::cbor_major_type::semantic_tag)
        {
            uint64_t val = get_uint64_value(ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                return;
            }
            switch(val)
            {
                case 25: // stringref
                    other_tags_[stringref_tag] = true;
                    break;
                case 256: // stringref-namespace
                    other_tags_[stringref_namespace_tag] = true;
                    break;
                default:
                    other_tags_[item_tag] = true;
                    raw_tag_ = val;
                    break;
            }
            c = source_.peek();
            if (JSONCONS_UNLIKELY(c.eof))
            {
                ec = cbor_errc::unexpected_eof;
                more_ = false;
                return;
            }
            major_type = get_major_type(c.value);
        }
    }